

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::BasicUsageCS::Run(BasicUsageCS *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char *format;
  ulong uVar6;
  allocator<char> local_849;
  string local_848;
  GLuint data [512];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_ARB_compute_shader");
  if ((!bVar2) ||
     (bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)
                         ->m_contextInfo,"GL_ARB_shader_storage_buffer_object"), !bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,
               "GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported",
               (allocator<char> *)data);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)data,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  uint data_inc[256];\n  uint data_dec[256];\n} g_out;\nvoid main() {\n  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
             ,&local_849);
  GVar3 = CreateComputeProgram(this,(string *)data);
  this->prog_ = GVar3;
  std::__cxx11::string::~string((string *)data);
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
  bVar2 = CheckProgram(this,this->prog_,(bool *)0x0);
  if (!bVar2) {
    return -1;
  }
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
  uVar6 = 0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
  puVar4 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,10);
  *puVar4 = 0x10000000000;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,1,1);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x800,data);
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(data,&stack0xffffffffffffffd8);
  do {
    if (0x1ff < uVar6) {
LAB_0099cb5e:
      return -(ulong)(uVar6 < 0x200);
    }
    uVar1 = data[uVar6];
    uVar5 = (ulong)data[uVar6 + 1];
    if (uVar1 != data[uVar6 + 1]) {
      format = "Pair of values should be equal, got: %d, %d\n";
LAB_0099cb57:
      gl4cts::anon_unknown_0::Output(format,(ulong)uVar1,uVar5);
      goto LAB_0099cb5e;
    }
    if ((uVar6 < 0x1fe) && (uVar1 == data[uVar6 + 2])) {
      format = "Too many same values found: %d, index: %d\n";
      uVar5 = uVar6 & 0xffffffff;
      goto LAB_0099cb57;
    }
    uVar6 = uVar6 + 2;
  } while( true );
}

Assistant:

virtual long Run()
	{

		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader") ||
			!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
		{
			OutputNotSupported("GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported");
			return NO_ERROR;
		}

		// create program
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
			   "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;" NL
			   "layout(std430) buffer Output {" NL "  uint data_inc[256];" NL "  uint data_dec[256];" NL "} g_out;" NL
			   "void main() {" NL "  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);" NL
			   "  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 512 * sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glDispatchCompute(4, 1, 1);

		GLuint data[512];
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, 512 * sizeof(GLuint), &data[0]);

		std::sort(data, data + 512);
		for (int i = 0; i < 512; i += 2)
		{
			if (data[i] != data[i + 1])
			{
				Output("Pair of values should be equal, got: %d, %d\n", data[i], data[i + 1]);
				return ERROR;
			}
			if (i < 510 && data[i] == data[i + 2])
			{
				Output("Too many same values found: %d, index: %d\n", data[i], i);
				return ERROR;
			}
		}

		return NO_ERROR;
	}